

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

CBString * itemTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  undefined7 in_register_00000031;
  char *s;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 0x3c:
    s = "Root";
    break;
  case 0x3d:
    s = "Capsule";
    break;
  case 0x3e:
    s = "Image";
    break;
  case 0x3f:
    s = "Region";
    break;
  case 0x40:
    s = "Padding";
    break;
  case 0x41:
    s = "Volume";
    break;
  case 0x42:
    s = "File";
    break;
  case 0x43:
    s = "Section";
    break;
  case 0x44:
    s = "Free space";
    break;
  case 0x45:
    s = "VSS store";
    break;
  case 0x46:
    s = "VSS2 store";
    break;
  case 0x47:
    s = "FTW store";
    break;
  case 0x48:
    s = "FDC store";
    break;
  case 0x49:
    s = "SysF store";
    break;
  case 0x4a:
    s = "EVSA store";
    break;
  case 0x4b:
    s = "FlashMap store";
    break;
  case 0x4c:
    s = "FlashDeviceMap store";
    break;
  case 0x4d:
    s = "CMDB store";
    break;
  case 0x4e:
    s = "NVAR GUID store";
    break;
  case 0x4f:
    s = "NVAR entry";
    break;
  case 0x50:
    s = "VSS entry";
    break;
  case 0x51:
    s = "SysF entry";
    break;
  case 0x52:
    s = "EVSA entry";
    break;
  case 0x53:
    s = "FlashMap entry";
    break;
  case 0x54:
    s = "FlashDeviceMap entry";
    break;
  case 0x55:
    s = "Microcode";
    break;
  case 0x56:
    s = "SLIC data";
    break;
  case 0x57:
    s = "IFWI header";
    break;
  case 0x58:
    s = "IFWI partition";
    break;
  case 0x59:
    s = "FPT store";
    break;
  case 0x5a:
    s = "FPT entry";
    break;
  case 0x5b:
    s = "FPT partition";
    break;
  case 0x5c:
    s = "BPDT store";
    break;
  case 0x5d:
    s = "BPDT entry";
    break;
  case 0x5e:
    s = "BPDT partition";
    break;
  case 0x5f:
    s = "CPD store";
    break;
  case 0x60:
    s = "CPD entry";
    break;
  case 0x61:
    s = "CPD partition";
    break;
  case 0x62:
    s = "CPD extension";
    break;
  case 99:
    s = "CPD SPI entry";
    break;
  case 100:
    s = "Startup AP data";
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",type);
    return __return_storage_ptr__;
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString itemTypeToUString(const UINT8 type)
{
    switch (type) {
        case Types::Root:                       return UString("Root");
        case Types::Image:                      return UString("Image");
        case Types::Capsule:                    return UString("Capsule");
        case Types::Region:                     return UString("Region");
        case Types::Volume:                     return UString("Volume");
        case Types::Padding:                    return UString("Padding");
        case Types::File:                       return UString("File");
        case Types::Section:                    return UString("Section");
        case Types::FreeSpace:                  return UString("Free space");
        case Types::VssStore:                   return UString("VSS store");
        case Types::Vss2Store:                  return UString("VSS2 store");
        case Types::FtwStore:                   return UString("FTW store");
        case Types::FdcStore:                   return UString("FDC store");
        case Types::SysFStore:                  return UString("SysF store");
        case Types::EvsaStore:                  return UString("EVSA store");
        case Types::CmdbStore:                  return UString("CMDB store");
        case Types::PhoenixFlashMapStore:       return UString("FlashMap store");
        case Types::InsydeFlashDeviceMapStore:  return UString("FlashDeviceMap store");
        case Types::NvarGuidStore:              return UString("NVAR GUID store");
        case Types::NvarEntry:                  return UString("NVAR entry");
        case Types::VssEntry:                   return UString("VSS entry");
        case Types::SysFEntry:                  return UString("SysF entry");
        case Types::EvsaEntry:                  return UString("EVSA entry");
        case Types::PhoenixFlashMapEntry:       return UString("FlashMap entry");
        case Types::InsydeFlashDeviceMapEntry:  return UString("FlashDeviceMap entry");
        case Types::Microcode:                  return UString("Microcode");
        case Types::SlicData:                   return UString("SLIC data");
        case Types::FptStore:                   return UString("FPT store");
        case Types::FptEntry:                   return UString("FPT entry");
        case Types::IfwiHeader:                 return UString("IFWI header");
        case Types::IfwiPartition:              return UString("IFWI partition");
        case Types::FptPartition:               return UString("FPT partition");
        case Types::BpdtStore:                  return UString("BPDT store");
        case Types::BpdtEntry:                  return UString("BPDT entry");
        case Types::BpdtPartition:              return UString("BPDT partition");
        case Types::CpdStore:                   return UString("CPD store");
        case Types::CpdEntry:                   return UString("CPD entry");
        case Types::CpdPartition:               return UString("CPD partition");
        case Types::CpdExtension:               return UString("CPD extension");
        case Types::CpdSpiEntry:                return UString("CPD SPI entry");
        case Types::StartupApDataEntry:         return UString("Startup AP data");
    }
    
    return usprintf("Unknown %02Xh", type);
}